

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall Gluco::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  CRef cr;
  bool bVar1;
  Clause *c;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  for (lVar4 = 0; lVar4 < cs->sz; lVar4 = lVar4 + 1) {
    c = (Clause *)
        RegionAllocator<unsigned_int>::operator[]
                  (&(this->ca).super_RegionAllocator<unsigned_int>,cs->data[lVar4]);
    bVar1 = satisfied(this,c);
    cr = cs->data[lVar4];
    if (bVar1) {
      removeClause(this,cr);
    }
    else {
      lVar2 = (long)iVar3;
      iVar3 = iVar3 + 1;
      cs->data[lVar2] = cr;
    }
  }
  vec<unsigned_int>::shrink(cs,(int)lVar4 - iVar3);
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c)) 
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}